

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterManager.hpp
# Opt level: O0

bool __thiscall
Parameter<std::__cxx11::string>::internalSetData<std::vector<double,std::allocator<double>>>
          (Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,vector<double,_std::allocator<double>_> *data)

{
  byte bVar1;
  bool bVar2;
  long in_RDI;
  bool result;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> tmp;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffa0;
  vector<double,_std::allocator<double>_> local_50;
  byte local_31;
  string local_30 [8];
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffd8;
  undefined8 in_stack_ffffffffffffffe0;
  
  std::__cxx11::string::string(local_30);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffffe0,
             in_stack_ffffffffffffffd8);
  bVar2 = ParameterTraits<std::__cxx11::string>::convert<std::vector<double,std::allocator<double>>>
                    (&local_50,(RepType *)local_30);
  std::vector<double,_std::allocator<double>_>::~vector(in_stack_ffffffffffffffa0);
  local_31 = bVar2;
  if (bVar2) {
    *(undefined1 *)(in_RDI + 0x2a) = 0;
    std::__cxx11::string::operator=((string *)(in_RDI + 0x30),local_30);
  }
  bVar1 = local_31;
  std::__cxx11::string::~string(local_30);
  return (bool)(bVar1 & 1);
}

Assistant:

bool internalSetData(T data) {
    ParamType tmp {};
    bool result = ValueType::convert(data, tmp);
    if (result) {
      empty_ = false;
      data_  = tmp;
    }
    return result;
  }